

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Runtime::Runtime(Runtime *this)

{
  StaticArena<4096UL,_16UL> *pSVar1;
  _Rb_tree_header *p_Var2;
  rep rVar3;
  SymbolType symbol;
  long lVar4;
  pair<const_char_*,_Jinx::Impl::SymbolType> local_40;
  
  (this->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
  super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
  super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_IRuntime)._vptr_IRuntime = (_func_int **)&PTR_Compile_0014f8d8;
  pSVar1 = &this->m_staticArena;
  (this->m_staticArena).m_ptr = pSVar1->m_buffer;
  (this->m_libraryMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_libraryMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_libraryMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_libraryMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_libraryMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_libraryMap)._M_t._M_impl.super__Node_allocator.m_arena = pSVar1;
  (this->m_libraryMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_libraryMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var2 = &(this->m_libraryMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_libraryMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_libraryMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->m_libraryMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_functionMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_functionMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_functionMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_functionMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_functionMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_functionMap)._M_t._M_impl.super__Node_allocator.m_arena = pSVar1;
  p_Var2 = &(this->m_functionMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_functionMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_functionMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_functionMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_functionMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->m_propertyMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_propertyMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->m_propertyMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_propertyMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_functionMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_propertyMutex).super___mutex_base._M_mutex.__align = 0;
  (this->m_propertyMap)._M_t._M_impl.super__Node_allocator.m_arena = pSVar1;
  (this->m_propertyMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_propertyMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var2 = &(this->m_propertyMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_propertyMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_propertyMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->m_propertyMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_perfMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_perfMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_perfMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_perfMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_perfMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_perfStats).compilationTimeNs = 0;
  (this->m_perfStats).executionTimeNs = 0;
  (this->m_perfStats).perfTimeNs = 0;
  (this->m_perfStats).scriptCompilationCount = 0;
  (this->m_perfStats).scriptExecutionCount = 0;
  (this->m_perfStats).scriptCompletionCount = 0;
  (this->m_perfStats).instructionCount = 0;
  (this->m_perfStartTime).__d.__r = 0;
  (this->m_symbolTypeMap)._M_t._M_impl.super__Node_allocator.m_arena = pSVar1;
  p_Var2 = &(this->m_symbolTypeMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_symbolTypeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_symbolTypeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_symbolTypeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_symbolTypeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header
  ;
  (this->m_symbolTypeMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  rVar3 = std::chrono::_V2::system_clock::now();
  (this->m_perfStartTime).__d.__r = rVar3;
  for (lVar4 = -0x3c; lVar4 != 0; lVar4 = lVar4 + 1) {
    symbol = (int)lVar4 + NumSymbols;
    local_40.first = GetSymbolTypeText(symbol);
    local_40.second = symbol;
    std::
    _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,Jinx::Impl::SymbolType>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,Jinx::Impl::SymbolType>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,Jinx::StaticAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,Jinx::Impl::SymbolType>,4096ul,16ul>>
    ::_M_emplace_unique<std::pair<char_const*,Jinx::Impl::SymbolType>>
              ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,Jinx::Impl::SymbolType>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,Jinx::Impl::SymbolType>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,Jinx::StaticAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,Jinx::Impl::SymbolType>,4096ul,16ul>>
                *)&this->m_symbolTypeMap,&local_40);
  }
  return;
}

Assistant:

inline_t Runtime::Runtime()
	{
		m_perfStartTime = std::chrono::high_resolution_clock::now();

		// Build symbol type map, excluding symbols without a text representation
		for (size_t i = static_cast<size_t>(SymbolType::ForwardSlash); i < static_cast<size_t>(SymbolType::NumSymbols); ++i)
		{
			SymbolType symType = static_cast<SymbolType>(i);
			auto symTypeText = GetSymbolTypeText(symType);
			m_symbolTypeMap.insert(std::make_pair(symTypeText, symType));
		}
	}